

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExeCommander.cpp
# Opt level: O0

char cmd_util::addrTypeToChar(addr_type type)

{
  undefined1 local_9;
  addr_type type_local;
  
  if (type == RAW) {
    local_9 = 'r';
  }
  else if (type == RVA) {
    local_9 = 'v';
  }
  else if (type == VA) {
    local_9 = 'V';
  }
  else {
    local_9 = '_';
  }
  return local_9;
}

Assistant:

char cmd_util::addrTypeToChar(Executable::addr_type type)
{
    switch (type) {
        case Executable::RAW: return 'r';
        case Executable::RVA: return 'v';
        case Executable::VA: return 'V';
        default:
            return '_';
    }
    return '_';
}